

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_custom_test.cpp
# Opt level: O0

void __thiscall
log_custom_test_DefaultConstructor_Test::TestBody(log_custom_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char name [11];
  int *in_stack_fffffffffffffe70;
  int *in_stack_fffffffffffffe78;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  char *in_stack_fffffffffffffe88;
  AssertHelper local_f0;
  Message local_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b8;
  undefined4 local_b4;
  AssertionResult local_b0;
  AssertHelper local_a0;
  Message local_98;
  undefined4 local_90;
  undefined4 local_8c;
  AssertionResult local_88;
  AssertHelper local_78;
  Message local_70;
  undefined4 local_68;
  undefined4 local_64;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_30;
  undefined4 local_2c;
  AssertionResult local_28;
  undefined7 local_18;
  undefined4 uStack_11;
  
  local_18 = 0x5f6d6f74737563;
  uStack_11 = 0x676f6c;
  local_2c = 0;
  local_30 = log_create(&local_18);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10ad0b);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_custom_test/source/log_custom_test.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x10ad6e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10adc6);
  local_64 = 0;
  uVar3 = log_policy_format_custom(0,format_size,format_serialize,format_deserialize);
  uVar4 = log_policy_schedule_sync();
  uVar5 = log_policy_storage_sequential();
  uVar6 = log_policy_stream_custom(0,stream_write,stream_flush);
  local_68 = log_configure_impl(&local_18,4,uVar3,uVar4,uVar5,uVar6);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10aefa);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_custom_test/source/log_custom_test.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x10af57);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10afaf);
  local_8c = 0;
  local_90 = log_write_impl_va(&local_18,0x87,"TestBody",
                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_custom_test/source/log_custom_test.cpp"
                               ,1,"hello world");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10b086);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_custom_test/source/log_custom_test.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message((Message *)0x10b0e3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b13b);
  local_b4 = 0;
  local_b8 = log_write_impl_va(&local_18,0x8a,"TestBody",
                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_custom_test/source/log_custom_test.cpp"
                               ,1,"hello world from log %d",0x14);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    in_stack_fffffffffffffe88 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10b21b);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_custom_test/source/log_custom_test.cpp"
               ,0x8a,in_stack_fffffffffffffe88);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x10b278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b2cd);
  local_dc = 0;
  local_e0 = log_clear(&local_18);
  this_00 = &local_d8;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),(int *)this_00,
             in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10b382);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_custom_test/source/log_custom_test.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message((Message *)0x10b3df);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b434);
  return;
}

Assistant:

TEST_F(log_custom_test, DefaultConstructor)
{
	const char name[] = "custom_log";

	/* Create logs */
	EXPECT_EQ((int)0, (int)log_create(name));

	/* Set policies */
	EXPECT_EQ((int)0, (int)log_configure(name,
						  log_policy_format_custom(NULL, &format_size, &format_serialize, &format_deserialize),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_custom(NULL, &stream_write, &stream_flush)));

	/* Write simple logs */
	EXPECT_EQ((int)0, (int)log_write(name, LOG_LEVEL_INFO, "hello world"));

	/* Write varidic log */
	EXPECT_EQ((int)0, (int)log_write(name, LOG_LEVEL_INFO, "hello world from log %d", 20));

	/* Clear log */
	EXPECT_EQ((int)0, (int)log_clear(name));
}